

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_refs.c
# Opt level: O0

HEVCFrame * alloc_frame(HEVCContext *s)

{
  MppFrameFormat MVar1;
  MPP_RET MVar2;
  HEVCFrame *pHVar3;
  RK_U32 local_34;
  RK_U32 fbc_hdr_stride;
  HEVCFrame *frame;
  MppFrameFormat fmt;
  MPP_RET ret;
  RK_U32 i;
  HEVCContext *s_local;
  
  MVar1 = (s->h265dctx->cfg->base).out_fmt;
  fmt = MPP_FMT_YUV420SP;
  while( true ) {
    if (MPP_FMT_YUV444P < fmt) {
      _mpp_log_l(2,"H265_PARSER_REF","Error allocating frame, DPB full.\n",(char *)0x0);
      return (HEVCFrame *)0x0;
    }
    pHVar3 = s->DPB + fmt;
    if (pHVar3->slot_index == 0xff) break;
    fmt = fmt + MPP_FMT_YUV420SP_10BIT;
  }
  if ((h265d_debug & 0x40) != 0) {
    _mpp_log_l(4,"H265_PARSER_REF","width = %d height = %d",(char *)0x0,
               (ulong)(uint)s->h265dctx->width,(ulong)(uint)s->h265dctx->height);
  }
  mpp_frame_set_width(pHVar3->frame,s->h265dctx->width);
  mpp_frame_set_height(pHVar3->frame,s->h265dctx->height);
  mpp_frame_set_hor_stride
            (pHVar3->frame,
             (s->h265dctx->coded_width + 0x3fU & 0xffffffc0) * s->h265dctx->nBitDepth >> 3);
  mpp_frame_set_ver_stride(pHVar3->frame,s->h265dctx->coded_height);
  s->h265dctx->pix_fmt = s->h265dctx->pix_fmt & 0xfffff;
  if (s->is_hdr != 0) {
    s->h265dctx->pix_fmt = s->h265dctx->pix_fmt | 0x4000000;
  }
  s->h265dctx->pix_fmt = MVar1 & 0xfff00000 | s->h265dctx->pix_fmt;
  mpp_frame_set_fmt(pHVar3->frame,s->h265dctx->pix_fmt);
  if ((s->h265dctx->pix_fmt & 0xf00000) == 0) {
    if (((((s->h265dctx->pix_fmt & 0x2000000) == 0) &&
         (((s->h265dctx->cfg->base).enable_vproc & 2) != 0)) && (s->h265dctx->width < 0x781)) &&
       (s->h265dctx->height < 0x441)) {
      mpp_frame_set_mode(pHVar3->frame,0xc);
    }
  }
  else {
    local_34 = s->h265dctx->width + 0x3fU & 0xffffffc0;
    mpp_slots_set_prop(s->slots,SLOTS_HOR_ALIGN,hor_align_64);
    mpp_frame_set_offset_x(pHVar3->frame,0);
    mpp_frame_set_offset_y(pHVar3->frame,4);
    if (*compat_ext_fbc_buf_size != 0) {
      mpp_frame_set_ver_stride(pHVar3->frame,s->h265dctx->coded_height + 0x10);
    }
    if (*compat_ext_fbc_hdr_256_odd != 0) {
      local_34 = s->h265dctx->width + 0xffU & 0xffffff00 | 0x100;
    }
    mpp_frame_set_fbc_hdr_stride(pHVar3->frame,local_34);
  }
  if (((s->h265dctx->cfg->base).enable_thumbnail == 0) ||
     ((*(ulong *)&s->h265dctx->hw_info->field_0x4 >> 0x13 & 1) == 0)) {
    mpp_frame_set_thumbnail_en(pHVar3->frame,0);
  }
  else {
    mpp_frame_set_thumbnail_en(pHVar3->frame,(s->h265dctx->cfg->base).enable_thumbnail);
  }
  mpp_frame_set_errinfo(pHVar3->frame,0);
  mpp_frame_set_pts(pHVar3->frame,s->pts);
  mpp_frame_set_poc(pHVar3->frame,s->poc);
  mpp_frame_set_color_range(pHVar3->frame,s->h265dctx->color_range);
  mpp_frame_set_color_primaries(pHVar3->frame,(uint)(s->sps->vui).colour_primaries);
  if ((s->alternative_transfer).present == 0) {
    mpp_frame_set_color_trc(pHVar3->frame,(uint)(s->sps->vui).transfer_characteristic);
  }
  else {
    mpp_frame_set_color_trc
              (pHVar3->frame,(s->alternative_transfer).preferred_transfer_characteristics);
  }
  mpp_frame_set_colorspace(pHVar3->frame,s->h265dctx->colorspace);
  mpp_frame_set_mastering_display(pHVar3->frame,s->mastering_display);
  mpp_frame_set_content_light(pHVar3->frame,s->content_light);
  if ((h265d_debug & 0x40) != 0) {
    _mpp_log_l(4,"H265_PARSER_REF","poc %d w_stride %d h_stride %d\n",(char *)0x0,
               (ulong)(uint)s->poc,(ulong)(uint)s->h265dctx->coded_width,s->h265dctx->coded_height);
  }
  MVar2 = mpp_buf_slot_get_unused(s->slots,&pHVar3->slot_index);
  if (MVar2 == MPP_OK) {
    return pHVar3;
  }
  _mpp_log_l(2,"H265_PARSER_REF","Assertion %s failed at %s:%d\n",(char *)0x0,"ret == MPP_OK",
             "alloc_frame",0x97);
  if ((mpp_debug & 0x10000000) == 0) {
    return pHVar3;
  }
  abort();
}

Assistant:

static HEVCFrame *alloc_frame(HEVCContext *s)
{
    RK_U32  i;
    MPP_RET ret = MPP_OK;
    MppFrameFormat fmt = s->h265dctx->cfg->base.out_fmt & (~MPP_FRAME_FMT_MASK);

    for (i = 0; i < MPP_ARRAY_ELEMS(s->DPB); i++) {
        HEVCFrame *frame = &s->DPB[i];
        if (frame->slot_index != 0xff) {
            continue;
        }

        h265d_dbg(H265D_DBG_GLOBAL, "width = %d height = %d", s->h265dctx->width, s->h265dctx->height);
        mpp_frame_set_width(frame->frame, s->h265dctx->width);
        mpp_frame_set_height(frame->frame, s->h265dctx->height);
        mpp_frame_set_hor_stride(frame->frame,
                                 (MPP_ALIGN(s->h265dctx->coded_width, 64) * s->h265dctx->nBitDepth) >> 3);
        mpp_frame_set_ver_stride(frame->frame, s->h265dctx->coded_height);
        s->h265dctx->pix_fmt &= MPP_FRAME_FMT_MASK;
        if (s->is_hdr) {
            s->h265dctx->pix_fmt |= MPP_FRAME_HDR;
        }
        s->h265dctx->pix_fmt |= fmt;
        mpp_frame_set_fmt(frame->frame, s->h265dctx->pix_fmt);

        if (MPP_FRAME_FMT_IS_FBC(s->h265dctx->pix_fmt)) {
            RK_U32 fbc_hdr_stride = MPP_ALIGN(s->h265dctx->width, 64);

            mpp_slots_set_prop(s->slots, SLOTS_HOR_ALIGN, hor_align_64);
            mpp_frame_set_offset_x(frame->frame, 0);
            mpp_frame_set_offset_y(frame->frame, 4);

            if (*compat_ext_fbc_buf_size)
                mpp_frame_set_ver_stride(frame->frame, s->h265dctx->coded_height + 16);

            if (*compat_ext_fbc_hdr_256_odd)
                fbc_hdr_stride = MPP_ALIGN(s->h265dctx->width, 256) | 256;

            mpp_frame_set_fbc_hdr_stride(frame->frame, fbc_hdr_stride);
        } else if (MPP_FRAME_FMT_IS_TILE(s->h265dctx->pix_fmt)) {
            /* nothing todo */
        } else {
            if ((s->h265dctx->cfg->base.enable_vproc & MPP_VPROC_MODE_DETECTION) &&
                s->h265dctx->width <= 1920 &&  s->h265dctx->height <= 1088)
                mpp_frame_set_mode(frame->frame, MPP_FRAME_FLAG_DEINTERLACED);
        }

        if (s->h265dctx->cfg->base.enable_thumbnail && s->h265dctx->hw_info->cap_down_scale)
            mpp_frame_set_thumbnail_en(frame->frame, s->h265dctx->cfg->base.enable_thumbnail);
        else
            mpp_frame_set_thumbnail_en(frame->frame, 0);

        mpp_frame_set_errinfo(frame->frame, 0);
        mpp_frame_set_pts(frame->frame, s->pts);
        mpp_frame_set_poc(frame->frame, s->poc);
        mpp_frame_set_color_range(frame->frame, s->h265dctx->color_range);
        mpp_frame_set_color_primaries(frame->frame, s->sps->vui.colour_primaries);
        if (s->alternative_transfer.present)
            mpp_frame_set_color_trc(frame->frame,
                                    s->alternative_transfer.preferred_transfer_characteristics);
        else
            mpp_frame_set_color_trc(frame->frame, s->sps->vui.transfer_characteristic);
        mpp_frame_set_colorspace(frame->frame, s->h265dctx->colorspace);
        mpp_frame_set_mastering_display(frame->frame, s->mastering_display);
        mpp_frame_set_content_light(frame->frame, s->content_light);

        h265d_dbg(H265D_DBG_GLOBAL, "poc %d w_stride %d h_stride %d\n",
                  s->poc, s->h265dctx->coded_width, s->h265dctx->coded_height);
        ret = mpp_buf_slot_get_unused(s->slots, &frame->slot_index);
        mpp_assert(ret == MPP_OK);
        return frame;
    }
    mpp_err( "Error allocating frame, DPB full.\n");
    return NULL;
}